

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckms_quantiles.h
# Opt level: O2

void __thiscall
prometheus::detail::CKMSQuantiles::CKMSQuantiles(CKMSQuantiles *this,CKMSQuantiles *param_1)

{
  size_t sVar1;
  
  sVar1 = param_1->count_;
  (this->quantiles_)._M_data = (param_1->quantiles_)._M_data;
  this->count_ = sVar1;
  std::
  vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
  ::vector(&this->sample_,&param_1->sample_);
  memcpy(&this->buffer_,&param_1->buffer_,0xfa8);
  return;
}

Assistant:

class PROMETHEUS_CPP_CORE_EXPORT CKMSQuantiles {
 public:
  struct PROMETHEUS_CPP_CORE_EXPORT Quantile {
    Quantile(double quantile, double error);

    double quantile;
    double error;
    double u;
    double v;
  }